

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<std::tuple<float,float,float>>::
Generators<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>>
          (Generators<std::tuple<float,float,float>> *this,
          GeneratorWrapper<std::tuple<float,_float,_float>_> *moreGenerators)

{
  GeneratorWrapper<std::tuple<float,_float,_float>_> *moreGenerators_local;
  Generators<std::tuple<float,_float,_float>_> *this_local;
  
  IGenerator<std::tuple<float,_float,_float>_>::IGenerator
            ((IGenerator<std::tuple<float,_float,_float>_> *)this);
  *(undefined ***)this = &PTR_next_007be438;
  std::
  vector<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
  ::vector((vector<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
            *)(this + 0x30));
  *(undefined8 *)(this + 0x48) = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
  ::reserve((vector<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<float,_float,_float>_>_>_>
             *)(this + 0x30),1);
  add_generators<Catch::Generators::GeneratorWrapper<std::tuple<float,float,float>>>
            (this,moreGenerators);
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }